

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void sbc_F1(void)

{
  ubyte local_c;
  ushort local_a;
  uint answer;
  uint flags;
  
  except = '\0';
  asm("push ax");
  temp2 = getbyte(pc);
  temp1 = getbyte((ushort)RAM[temp2] + (ushort)RAM[temp2 + 1 & 0xff] * 0x100 + (ushort)y_reg);
  asm("CLC");
  if (carry_f == '\0') {
    asm("STC");
  }
  _AL = acc;
  _AH = temp1;
  asm("sbb AL,AH");
  asm("pushf");
  asm("pop flags");
  asm("push AX");
  asm("pop answer");
  asm("pop AX");
  acc = local_c;
  result_f = local_c;
  ovr_f = (local_a & 0x800) != 0;
  carry_f = (byte)local_a & 1 ^ 1;
  pc = pc + 1;
  return;
}

Assistant:

void sbc_F1(void) {
    uint flags;
    uint answer;
    CLE;
    asm("push ax");

    temp2 = getbyte(pc);
    temp1 = getbyte(RAM[temp2] + 0x100 * RAM[(ubyte) (temp2 + 1)] + y_reg);

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("sbb AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("push AX");
    asm("pop answer");
    asm("pop AX");

    result_f = acc = answer;
    (flags & 0x800) ? (ovr_f = 1) : (ovr_f = 0);
    carry_f = (flags & 0x01) ^ 1;

    pc++;
}